

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O2

shared_ptr<void> __thiscall pstore::database::getrw(database *this,address addr,size_t size)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<void> sVar1;
  undefined1 local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  (**(code **)(*(long *)addr.a_ + 0x10))(local_20);
  std::const_pointer_cast<void,void_const>((shared_ptr<const_void> *)this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  sVar1.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<void>)sVar1.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<void> getrw (address const addr, std::size_t const size) {
            return std::const_pointer_cast<void> (
                this->get (addr, size, true /*initialized*/, true /*writable*/));
        }